

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Var::set_size_param(Var *this,uint32_t index,Var *param)

{
  allocator<const_kratos::IRNode_*> *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *pVVar1;
  bool bVar2;
  uint uVar3;
  UserException *pUVar4;
  size_type sVar5;
  mapped_type *ppVVar6;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *puVar7;
  reference ppPVar8;
  uint64_t uVar9;
  element_type *peVar10;
  reference pvVar11;
  VarException *this_01;
  reference pvVar12;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  char (*format_str) [30];
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  value_type *p_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *__range1_1;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *params;
  ParamVisitor visitor;
  element_type *local_3e8;
  Var *local_3e0;
  element_type **local_3d8;
  size_type local_3d0;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_3c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  string local_390;
  type_conflict1 *local_370;
  type_conflict1 *low;
  type_conflict1 *high;
  undefined1 local_358 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  slice_index;
  shared_ptr<kratos::VarSlice> *slice;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *__range1;
  uint64_t new_dim_size;
  value_type *p;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *__range3;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *params_1;
  ParamVisitor visitor_1;
  Var *linked_param;
  _Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false> local_260;
  undefined1 local_251;
  char local_250 [32];
  string local_230;
  undefined1 local_20d;
  v7 local_200 [32];
  string local_1e0;
  Var *local_1c0;
  Var *param_local;
  Var *pVStack_1b0;
  uint32_t index_local;
  Var *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_1a0;
  basic_string_view<char> local_198;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_188;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_178;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_168;
  string *local_160;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_158;
  basic_string_view<char> local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_110;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs_1;
  char (*local_100) [32];
  char *local_f8;
  string *local_f0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_e8;
  basic_string_view<char> local_d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  char (*local_98) [51];
  char *local_90;
  string *local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_1c0 = param;
  param_local._4_4_ = index;
  pVStack_1b0 = this;
  if ((this->type_ != Base) && (this->type_ != PortIO)) {
    local_20d = 1;
    pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(local_200);
    local_160 = &local_1e0;
    local_168 = "{0} is not a variable or port";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_200;
    local_188.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string,char[30],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"{0} is not a variable or port",(v7 *)vargs,format_str,in_RCX);
    local_178 = &local_188;
    local_198 = fmt::v7::to_string_view<char,_0>(local_168);
    local_78 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_80 = local_178;
    local_70 = local_178;
    local_60 = local_178;
    local_68 = local_78;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_78,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_178->string);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_1a0.values_;
    format_str_00.size_ = (size_t)this_local;
    format_str_00.data_ = (char *)local_198.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_1e0,(detail *)local_198.data_,format_str_00,args);
    UserException::UserException(pUVar4,&local_1e0);
    local_20d = 0;
    __cxa_throw(pUVar4,&UserException::typeinfo,UserException::~UserException);
  }
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->size_);
  if (sVar5 <= index) {
    local_251 = 1;
    pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(local_250);
    local_f0 = &local_230;
    local_f8 = "{0} does not have {1} dimension";
    local_100 = &local_250;
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
               *)((long)&param_local + 4);
    fmt::v7::make_args_checked<std::__cxx11::string,unsigned_int&,char[32],char>
              (&local_138,(v7 *)"{0} does not have {1} dimension",local_100,
               (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_1,
               (remove_reference_t<unsigned_int_&> *)in_R8);
    local_110 = &local_138;
    local_148 = fmt::v7::to_string_view<char,_0>(local_f8);
    local_50 = &local_158;
    local_58 = local_110;
    local_48 = local_110;
    local_38 = local_110;
    local_40 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0x2d,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_110);
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_158.field_1.values_;
    format_str_01.size_ = local_158.desc_;
    format_str_01.data_ = (char *)local_148.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_230,(detail *)local_148.data_,format_str_01,args_00);
    UserException::UserException(pUVar4,&local_230);
    local_251 = 0;
    __cxa_throw(pUVar4,&UserException::typeinfo,UserException::~UserException);
  }
  if (local_1c0 == (Var *)0x0) {
    local_260._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
         ::find(&this->size_param_,(key_type *)((long)&param_local + 4));
    linked_param = (Var *)std::
                          unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
                          ::end(&this->size_param_);
    bVar2 = std::__detail::operator!=
                      (&local_260,
                       (_Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false> *)
                       &linked_param);
    if (bVar2) {
      ppVVar6 = std::
                unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
                ::at(&this->size_param_,(key_type *)((long)&param_local + 4));
      visitor_1.params_._M_h._M_single_bucket = (__node_base_ptr)*ppVVar6;
      ParamVisitor::ParamVisitor((ParamVisitor *)&params_1);
      IRVisitor::visit_root
                ((IRVisitor *)&params_1,(IRNode *)visitor_1.params_._M_h._M_single_bucket);
      puVar7 = ParamVisitor::params((ParamVisitor *)&params_1);
      __end3 = std::
               unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
               ::begin(puVar7);
      p = (value_type *)
          std::
          unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
          ::end(puVar7);
      while (bVar2 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<kratos::Param_*,_false>,
                                (_Node_iterator_base<kratos::Param_*,_false> *)&p), bVar2) {
        ppPVar8 = std::__detail::_Node_const_iterator<kratos::Param_*,_true,_false>::operator*
                            (&__end3);
        Param::remove_param_size_var
                  (*ppPVar8,this,param_local._4_4_,(Var *)visitor_1.params_._M_h._M_single_bucket);
        std::__detail::_Node_const_iterator<kratos::Param_*,_true,_false>::operator++(&__end3);
      }
      std::
      unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
      ::erase(&this->size_param_,(key_type *)((long)&param_local + 4));
      ParamVisitor::~ParamVisitor((ParamVisitor *)&params_1);
    }
  }
  else {
    uVar9 = Simulator::static_evaluate_expr(local_1c0);
    __end1 = std::
             vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             ::begin(&this->slices_);
    slice = (shared_ptr<kratos::VarSlice> *)
            std::
            vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
            ::end(&this->slices_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                                       *)&slice), bVar2) {
      slice_index.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                    ::operator*(&__end1);
      peVar10 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)slice_index.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar3 = (*(peVar10->super_Var).super_IRNode._vptr_IRNode[0x2b])();
      if ((uVar3 & 1) == 0) {
        peVar10 = std::
                  __shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)slice_index.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        (*(peVar10->super_Var).super_IRNode._vptr_IRNode[0x24])(local_358);
        sVar5 = std::
                vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ::size((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        *)local_358);
        if (param_local._4_4_ < sVar5) {
          pvVar11 = std::
                    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  *)local_358,(ulong)param_local._4_4_);
          high = *(type_conflict1 **)pvVar11;
          low = std::get<0ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)&high);
          local_370 = std::get<1ul,unsigned_int,unsigned_int>
                                ((pair<unsigned_int,_unsigned_int> *)&high);
          if ((uVar9 <= *low) || (uVar9 <= *local_370)) {
            visitor.params_._M_h._M_single_bucket._6_1_ = 1;
            this_01 = (VarException *)__cxa_allocate_exception(0x10);
            peVar10 = std::
                      __shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)slice_index.
                                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            (*(peVar10->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_3b0);
            local_88 = &local_390;
            local_90 = "Unable to parameterize dim {0} due to usage of {1}";
            local_98 = (char (*) [51])((long)&param_local + 4);
            vargs_2 = &local_3b0;
            fmt::v7::make_args_checked<unsigned_int&,std::__cxx11::string,char[51],char>
                      (&local_c8,(v7 *)"Unable to parameterize dim {0} due to usage of {1}",local_98
                       ,(remove_reference_t<unsigned_int_&> *)vargs_2,in_R8);
            local_a8 = &local_c8;
            local_d8 = fmt::v7::to_string_view<char,_0>(local_90);
            local_28 = &local_e8;
            local_30 = local_a8;
            local_20 = local_a8;
            local_10 = local_a8;
            local_18 = local_28;
            fmt::v7::
            basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::basic_format_args(local_28,0xd2,
                                (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)local_a8);
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args_01.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_e8.field_1.values_;
            format_str_02.size_ = local_e8.desc_;
            format_str_02.data_ = (char *)local_d8.size_;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_390,(detail *)local_d8.data_,format_str_02,args_01);
            local_3e8 = std::__shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2> *)
                                   slice_index.
                                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_3d8 = &local_3e8;
            local_3d0 = 2;
            this_00 = (allocator<const_kratos::IRNode_*> *)
                      ((long)&visitor.params_._M_h._M_single_bucket + 7);
            local_3e0 = this;
            std::allocator<const_kratos::IRNode_*>::allocator(this_00);
            __l._M_len = local_3d0;
            __l._M_array = (iterator)local_3d8;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      (&local_3c8,__l,this_00);
            VarException::VarException(this_01,&local_390,&local_3c8);
            visitor.params_._M_h._M_single_bucket._6_1_ = 0;
            __cxa_throw(this_01,&VarException::typeinfo,VarException::~VarException);
          }
        }
        std::
        vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_358);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
      ::operator++(&__end1);
    }
    __range1._0_4_ = (value_type)uVar9;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->size_,(ulong)param_local._4_4_);
    pVVar1 = local_1c0;
    *pvVar12 = (value_type)__range1;
    ppVVar6 = std::
              unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
              ::operator[](&this->size_param_,(key_type *)((long)&param_local + 4));
    *ppVVar6 = pVVar1;
    ParamVisitor::ParamVisitor((ParamVisitor *)&params);
    IRVisitor::visit_root((IRVisitor *)&params,&local_1c0->super_IRNode);
    puVar7 = ParamVisitor::params((ParamVisitor *)&params);
    __end1_1 = std::
               unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
               ::begin(puVar7);
    p_1 = (value_type *)
          std::
          unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
          ::end(puVar7);
    while (bVar2 = std::__detail::operator!=
                             (&__end1_1.super__Node_iterator_base<kratos::Param_*,_false>,
                              (_Node_iterator_base<kratos::Param_*,_false> *)&p_1), bVar2) {
      ppPVar8 = std::__detail::_Node_const_iterator<kratos::Param_*,_true,_false>::operator*
                          (&__end1_1);
      Param::add_param_size_var(*ppPVar8,this,param_local._4_4_,local_1c0);
      std::__detail::_Node_const_iterator<kratos::Param_*,_true,_false>::operator++(&__end1_1);
    }
    ParamVisitor::~ParamVisitor((ParamVisitor *)&params);
  }
  return;
}

Assistant:

void Var::set_size_param(uint32_t index, Var *param) {
    if (type_ != VarType::Base && type_ != VarType::PortIO)
        throw UserException(::format("{0} is not a variable or port", to_string()));
    if (index >= size_.size())
        throw UserException(::format("{0} does not have {1} dimension", to_string(), index));

    if (param == nullptr) {
        if (size_param_.find(index) != size_param_.end()) {
            auto *linked_param = size_param_.at(index);
            // get all the parameters
            ParamVisitor visitor;
            visitor.visit_root(linked_param);
            auto const &params = visitor.params();
            for (const auto &p : params) {
                p->remove_param_size_var(this, index, linked_param);
            }
            size_param_.erase(index);
        }
        return;
    }

    auto new_dim_size = Simulator::static_evaluate_expr(param);

    // LCOV_EXCL_STOP
    for (auto const &slice : slices_) {
        if (!slice->sliced_by_var()) {
            auto slice_index = slice->get_slice_index();
            if (slice_index.size() > index) {
                auto [high, low] = slice_index[index];
                if (high >= new_dim_size || low >= new_dim_size)
                    throw VarException(
                        ::format("Unable to parameterize dim {0} due to usage of {1}", index,
                                 slice->to_string()),
                        {slice.get(), this});
            }
        }
    }
    // all good. now we need to resize the index
    size_[index] = new_dim_size;
    size_param_[index] = param;

    // get all the parameters
    ParamVisitor visitor;
    visitor.visit_root(param);
    auto const &params = visitor.params();
    for (const auto &p : params) {
        p->add_param_size_var(this, index, param);
    }
}